

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_env_cwalk(mdb_copy *my,pgno_t *pg,int flags)

{
  undefined8 *puVar1;
  pgno_t *ppVar2;
  mdb_size_t *pmVar3;
  undefined2 *puVar4;
  MDB_env *pMVar5;
  char *pcVar6;
  pgno_t pVar7;
  MDB_page *pMVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  MDB_page *__ptr;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  MDB_page *dst;
  MDB_page *pMVar15;
  ulong uVar16;
  ushort uVar17;
  int local_234;
  MDB_page *mp;
  long local_210;
  ulong local_208;
  char *local_200;
  ulong local_1f8;
  anon_union_8_2_b62042e6_for_mp_p *local_1f0;
  MDB_db db;
  MDB_cursor local_1b8;
  
  if (*pg == 0xffffffffffffffff) {
    iVar10 = 0;
  }
  else {
    local_1b8.mc_snum = 1;
    local_1b8.mc_top = 0;
    local_1b8.mc_txn = my->mc_txn;
    iVar10 = mdb_page_get(&local_1b8,*pg,local_1b8.mc_pg,(int *)0x0);
    if ((iVar10 == 0) && (iVar10 = mdb_page_search_root(&local_1b8,(MDB_val *)0x0,4), iVar10 == 0))
    {
      pMVar5 = my->mc_env;
      uVar11 = pMVar5->me_psize;
      uVar14 = (ulong)uVar11;
      local_210 = CONCAT44(local_210._4_4_,(uint)local_1b8.mc_snum);
      __ptr = (MDB_page *)malloc((ulong)(uVar11 * local_1b8.mc_snum));
      if (__ptr == (MDB_page *)0x0) {
        iVar10 = 0xc;
      }
      else {
        uVar12 = (ulong)local_1b8.mc_top;
        dst = __ptr;
        local_1f0 = (anon_union_8_2_b62042e6_for_mp_p *)pg;
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          mdb_page_copy(dst,local_1b8.mc_pg[uVar16],(uint)uVar14);
          local_1b8.mc_pg[uVar16] = dst;
          uVar14 = (ulong)pMVar5->me_psize;
          dst = (MDB_page *)((long)dst->mp_ptrs + (uVar14 - 0x10));
        }
        local_234 = my->mc_toggle;
        uVar17 = (ushort)local_210;
        while (iVar10 = 0, uVar17 != 0) {
          uVar12 = uVar12 & 0xffff;
          pMVar15 = local_1b8.mc_pg[uVar12];
          uVar11 = (pMVar15->mp_pb).pb.pb_lower - 0x10 >> 1;
          mp = pMVar15;
          if ((pMVar15->mp_flags & 2) == 0) {
            uVar17 = local_1b8.mc_ki[uVar12] + 1;
            local_1b8.mc_ki[uVar12] = uVar17;
            if (uVar11 <= uVar17) goto LAB_0010f486;
            while( true ) {
              iVar10 = mdb_page_get(&local_1b8,
                                    (ulong)CONCAT24(*(undefined2 *)
                                                     ((long)pMVar15->mp_ptrs +
                                                     ((ulong)pMVar15->mp_ptrs[uVar17] - 0xc)),
                                                    *(undefined4 *)
                                                     ((long)pMVar15->mp_ptrs +
                                                     ((ulong)pMVar15->mp_ptrs[uVar17] - 0x10))),&mp,
                                    (int *)0x0);
              pMVar15 = mp;
              if (iVar10 != 0) goto LAB_0010f80d;
              uVar17 = local_1b8.mc_snum + 1;
              local_1b8.mc_top = local_1b8.mc_top + 1;
              uVar12 = (ulong)local_1b8.mc_top;
              local_1b8.mc_ki[uVar12] = 0;
              local_1b8.mc_snum = uVar17;
              if ((mp->mp_flags & 1) == 0) break;
              mdb_page_copy(local_1b8.mc_pg[uVar12],mp,my->mc_env->me_psize);
              uVar17 = local_1b8.mc_ki[local_1b8.mc_top];
            }
            local_1b8.mc_pg[uVar12] = mp;
          }
          else {
            if ((pMVar15->mp_flags & 0x20) == 0 && (flags & 4U) == 0) {
              uVar12 = (ulong)uVar11;
              local_208 = uVar12;
              for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
                lVar13 = (long)mp->mp_ptrs + ((ulong)mp->mp_ptrs[uVar14] - 0x10);
                uVar17 = *(ushort *)((long)mp->mp_ptrs + ((ulong)mp->mp_ptrs[uVar14] - 0xc));
                if ((uVar17 & 1) == 0) {
                  if ((uVar17 & 2) != 0) {
                    if (mp != dst) {
                      local_1b8.mc_pg[local_1b8.mc_top] = dst;
                      mdb_page_copy(dst,mp,my->mc_env->me_psize);
                      lVar13 = (long)dst->mp_ptrs + ((ulong)dst->mp_ptrs[uVar14] - 0x10);
                      mp = dst;
                    }
                    uVar12 = (ulong)*(ushort *)(lVar13 + 6);
                    puVar1 = (undefined8 *)(lVar13 + 8 + uVar12);
                    db._0_8_ = *puVar1;
                    db.md_branch_pages = puVar1[1];
                    ppVar2 = (pgno_t *)(lVar13 + 0x18 + uVar12);
                    db.md_leaf_pages = *ppVar2;
                    db.md_overflow_pages = ppVar2[1];
                    pmVar3 = (mdb_size_t *)(lVar13 + 0x28 + uVar12);
                    db.md_entries = *pmVar3;
                    db.md_root = pmVar3[1];
                    my->mc_toggle = local_234;
                    iVar10 = mdb_env_cwalk(my,&db.md_root,*(ushort *)(lVar13 + 4) & 4);
                    if (iVar10 != 0) goto LAB_0010f80d;
                    local_234 = my->mc_toggle;
                    uVar12 = (ulong)*(ushort *)(lVar13 + 6);
                    pmVar3 = (mdb_size_t *)(lVar13 + 0x28 + uVar12);
                    *pmVar3 = db.md_entries;
                    pmVar3[1] = db.md_root;
                    ppVar2 = (pgno_t *)(lVar13 + 0x18 + uVar12);
                    *ppVar2 = db.md_leaf_pages;
                    ppVar2[1] = db.md_overflow_pages;
                    puVar4 = (undefined2 *)(lVar13 + 8 + uVar12);
                    *puVar4 = (undefined2)db.md_pad;
                    puVar4[1] = db.md_pad._2_2_;
                    puVar4[2] = db.md_flags;
                    puVar4[3] = db.md_depth;
                    puVar4[4] = (undefined2)db.md_branch_pages;
                    puVar4[5] = db.md_branch_pages._2_2_;
                    puVar4[6] = db.md_branch_pages._4_2_;
                    puVar4[7] = db.md_branch_pages._6_2_;
                    uVar12 = local_208;
                  }
                }
                else {
                  if (mp != dst) {
                    local_1b8.mc_pg[local_1b8.mc_top] = dst;
                    mdb_page_copy(dst,mp,my->mc_env->me_psize);
                    lVar13 = (long)dst->mp_ptrs + ((ulong)dst->mp_ptrs[uVar14] - 0x10);
                    mp = dst;
                  }
                  local_210 = lVar13;
                  iVar10 = mdb_page_get(&local_1b8,
                                        *(pgno_t *)(lVar13 + 8 + (ulong)*(ushort *)(lVar13 + 6)),
                                        (MDB_page **)&db,(int *)0x0);
                  if (iVar10 != 0) goto LAB_0010f80d;
                  lVar13 = (long)local_234;
                  iVar10 = my->mc_wlen[lVar13];
                  local_1f8 = uVar14;
                  if (0xfffff < iVar10) {
                    iVar10 = mdb_env_cthr_toggle(my,1);
                    if (iVar10 != 0) goto LAB_0010f80d;
                    local_234 = my->mc_toggle;
                    lVar13 = (long)local_234;
                    iVar10 = my->mc_wlen[lVar13];
                  }
                  uVar9 = db._0_8_;
                  pcVar6 = my->mc_wbuf[lVar13];
                  local_200 = pcVar6 + iVar10;
                  memcpy(local_200,(void *)db._0_8_,(ulong)my->mc_env->me_psize);
                  pVar7 = my->mc_next_pgno;
                  *(pgno_t *)(pcVar6 + iVar10) = pVar7;
                  my->mc_next_pgno = *(uint *)(uVar9 + 0xc) + pVar7;
                  pMVar5 = my->mc_env;
                  my->mc_wlen[lVar13] = my->mc_wlen[lVar13] + pMVar5->me_psize;
                  if (1 < *(uint *)(uVar9 + 0xc)) {
                    my->mc_olen[lVar13] = (*(uint *)(uVar9 + 0xc) - 1) * pMVar5->me_psize;
                    my->mc_over[lVar13] = (char *)(uVar9 + (ulong)pMVar5->me_psize);
                    iVar10 = mdb_env_cthr_toggle(my,1);
                    if (iVar10 != 0) goto LAB_0010f80d;
                    local_234 = my->mc_toggle;
                  }
                  *(undefined8 *)(local_210 + 8 + (ulong)*(ushort *)(local_210 + 6)) =
                       *(undefined8 *)local_200;
                  uVar14 = local_1f8;
                  uVar12 = local_208;
                }
              }
            }
LAB_0010f486:
            lVar13 = (long)local_234;
            iVar10 = my->mc_wlen[lVar13];
            if (0xfffff < iVar10) {
              iVar10 = mdb_env_cthr_toggle(my,1);
              if (iVar10 != 0) break;
              local_234 = my->mc_toggle;
              lVar13 = (long)local_234;
              iVar10 = my->mc_wlen[lVar13];
            }
            pcVar6 = my->mc_wbuf[lVar13];
            pMVar15 = (MDB_page *)(pcVar6 + iVar10);
            mdb_page_copy(pMVar15,mp,my->mc_env->me_psize);
            pVar7 = my->mc_next_pgno;
            my->mc_next_pgno = pVar7 + 1;
            *(pgno_t *)(pcVar6 + iVar10) = pVar7;
            my->mc_wlen[lVar13] = my->mc_wlen[lVar13] + my->mc_env->me_psize;
            uVar12 = (ulong)local_1b8.mc_top;
            if (uVar12 == 0) {
              *local_1f0 = pMVar15->mp_p;
              iVar10 = 0;
              break;
            }
            pMVar8 = local_1b8.mc_pg[local_1b8.mc_top - 1];
            uVar14 = (ulong)pMVar8->mp_ptrs[local_1b8.mc_ki[local_1b8.mc_top - 1]];
            *(undefined2 *)((long)pMVar8->mp_ptrs + (uVar14 - 0x10)) = *(undefined2 *)&pMVar15->mp_p
            ;
            *(undefined2 *)((long)pMVar8->mp_ptrs + (uVar14 - 0xe)) =
                 *(undefined2 *)((long)&pMVar15->mp_p + 2);
            *(undefined2 *)((long)pMVar8->mp_ptrs + (uVar14 - 0xc)) =
                 *(undefined2 *)((long)&pMVar15->mp_p + 4);
            uVar17 = 0;
            if (local_1b8.mc_snum != 0) {
              local_1b8.mc_snum = local_1b8.mc_snum - 1;
              if (local_1b8.mc_snum == 0) {
                local_1b8.mc_flags = local_1b8.mc_flags & 0xfffffffe;
                uVar17 = 0;
              }
              else {
                uVar12 = (ulong)(local_1b8.mc_top - 1);
                local_1b8.mc_top = (unsigned_short)(local_1b8.mc_top - 1);
                uVar17 = 1;
              }
            }
          }
        }
LAB_0010f80d:
        free(__ptr);
      }
    }
  }
  return iVar10;
}

Assistant:

static int ESECT
mdb_env_cwalk(mdb_copy *my, pgno_t *pg, int flags)
{
	MDB_cursor mc;
	MDB_node *ni;
	MDB_page *mo, *mp, *leaf;
	char *buf, *ptr;
	int rc, toggle;
	unsigned int i;

	/* Empty DB, nothing to do */
	if (*pg == P_INVALID)
		return MDB_SUCCESS;

	mc.mc_snum = 1;
	mc.mc_top = 0;
	mc.mc_txn = my->mc_txn;

	rc = mdb_page_get(&mc, *pg, &mc.mc_pg[0], NULL);
	if (rc)
		return rc;
	rc = mdb_page_search_root(&mc, NULL, MDB_PS_FIRST);
	if (rc)
		return rc;

	/* Make cursor pages writable */
	buf = ptr = malloc(my->mc_env->me_psize * mc.mc_snum);
	if (buf == NULL)
		return ENOMEM;

	for (i=0; i<mc.mc_top; i++) {
		mdb_page_copy((MDB_page *)ptr, mc.mc_pg[i], my->mc_env->me_psize);
		mc.mc_pg[i] = (MDB_page *)ptr;
		ptr += my->mc_env->me_psize;
	}

	/* This is writable space for a leaf page. Usually not needed. */
	leaf = (MDB_page *)ptr;

	toggle = my->mc_toggle;
	while (mc.mc_snum > 0) {
		unsigned n;
		mp = mc.mc_pg[mc.mc_top];
		n = NUMKEYS(mp);

		if (IS_LEAF(mp)) {
			if (!IS_LEAF2(mp) && !(flags & F_DUPDATA)) {
				for (i=0; i<n; i++) {
					ni = NODEPTR(mp, i);
					if (ni->mn_flags & F_BIGDATA) {
						MDB_page *omp;
						pgno_t pg;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&pg, NODEDATA(ni), sizeof(pg));
						rc = mdb_page_get(&mc, pg, &omp, NULL);
						if (rc)
							goto done;
						if (my->mc_wlen[toggle] >= MDB_WBUF) {
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
						memcpy(mo, omp, my->mc_env->me_psize);
						mo->mp_pgno = my->mc_next_pgno;
						my->mc_next_pgno += omp->mp_pages;
						my->mc_wlen[toggle] += my->mc_env->me_psize;
						if (omp->mp_pages > 1) {
							my->mc_olen[toggle] = my->mc_env->me_psize * (omp->mp_pages - 1);
							my->mc_over[toggle] = (char *)omp + my->mc_env->me_psize;
							rc = mdb_env_cthr_toggle(my, 1);
							if (rc)
								goto done;
							toggle = my->mc_toggle;
						}
						memcpy(NODEDATA(ni), &mo->mp_pgno, sizeof(pgno_t));
					} else if (ni->mn_flags & F_SUBDATA) {
						MDB_db db;

						/* Need writable leaf */
						if (mp != leaf) {
							mc.mc_pg[mc.mc_top] = leaf;
							mdb_page_copy(leaf, mp, my->mc_env->me_psize);
							mp = leaf;
							ni = NODEPTR(mp, i);
						}

						memcpy(&db, NODEDATA(ni), sizeof(db));
						my->mc_toggle = toggle;
						rc = mdb_env_cwalk(my, &db.md_root, ni->mn_flags & F_DUPDATA);
						if (rc)
							goto done;
						toggle = my->mc_toggle;
						memcpy(NODEDATA(ni), &db, sizeof(db));
					}
				}
			}
		} else {
			mc.mc_ki[mc.mc_top]++;
			if (mc.mc_ki[mc.mc_top] < n) {
				pgno_t pg;
again:
				ni = NODEPTR(mp, mc.mc_ki[mc.mc_top]);
				pg = NODEPGNO(ni);
				rc = mdb_page_get(&mc, pg, &mp, NULL);
				if (rc)
					goto done;
				mc.mc_top++;
				mc.mc_snum++;
				mc.mc_ki[mc.mc_top] = 0;
				if (IS_BRANCH(mp)) {
					/* Whenever we advance to a sibling branch page,
					 * we must proceed all the way down to its first leaf.
					 */
					mdb_page_copy(mc.mc_pg[mc.mc_top], mp, my->mc_env->me_psize);
					goto again;
				} else
					mc.mc_pg[mc.mc_top] = mp;
				continue;
			}
		}
		if (my->mc_wlen[toggle] >= MDB_WBUF) {
			rc = mdb_env_cthr_toggle(my, 1);
			if (rc)
				goto done;
			toggle = my->mc_toggle;
		}
		mo = (MDB_page *)(my->mc_wbuf[toggle] + my->mc_wlen[toggle]);
		mdb_page_copy(mo, mp, my->mc_env->me_psize);
		mo->mp_pgno = my->mc_next_pgno++;
		my->mc_wlen[toggle] += my->mc_env->me_psize;
		if (mc.mc_top) {
			/* Update parent if there is one */
			ni = NODEPTR(mc.mc_pg[mc.mc_top-1], mc.mc_ki[mc.mc_top-1]);
			SETPGNO(ni, mo->mp_pgno);
			mdb_cursor_pop(&mc);
		} else {
			/* Otherwise we're done */
			*pg = mo->mp_pgno;
			break;
		}
	}
done:
	free(buf);
	return rc;
}